

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS ref_phys_minspac(REF_DBL reynolds_number,REF_DBL *yplus1)

{
  undefined8 uVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  *yplus1 = -1.0;
  dVar5 = reynolds_number * 0.06;
  if (dVar5 <= 0.0) {
    pcVar2 = "expected positive reynolds_number";
    uVar1 = 0x561;
  }
  else {
    dVar3 = log(dVar5);
    dVar4 = log(dVar5);
    if (dVar4 * dVar4 * *(double *)(&DAT_00206a30 + (ulong)(0.0 < dVar3 * dVar3 * 1e+20) * 8) <=
        0.445) {
      pcVar2 = "can not invert for cf";
      uVar1 = 0x563;
    }
    else {
      dVar5 = log(dVar5);
      dVar3 = 0.455 / (dVar5 * dVar5);
      dVar5 = dVar3 * 1e+20;
      if (dVar5 <= -dVar5) {
        dVar5 = -dVar5;
      }
      if (dVar5 <= 2.0) {
        pcVar2 = "can not invert cf";
        uVar1 = 0x565;
      }
      else {
        auVar6._0_8_ = reynolds_number * 1e+20;
        dVar5 = SQRT(2.0 / dVar3);
        auVar6._8_8_ = dVar5;
        auVar7._8_8_ = -dVar5;
        auVar7._0_8_ = -auVar6._0_8_;
        auVar7 = maxpd(auVar6,auVar7);
        if (auVar7._8_8_ < auVar7._0_8_) {
          *yplus1 = dVar5 / reynolds_number;
          return 0;
        }
        pcVar2 = "can not invert reynolds_number for yplus1";
        uVar1 = 0x567;
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar1,
         "ref_phys_minspac",pcVar2);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_phys_minspac(REF_DBL reynolds_number, REF_DBL *yplus1) {
  REF_DBL cf;
  *yplus1 = -1.0;
  /* laminar: 1.0 / ( sqrt(reynolds_number) *20.0 ); */
  RAS(0.06 * reynolds_number > 0, "expected positive reynolds_number");
  RAS(ref_math_divisible(0.445, pow(log(0.06 * reynolds_number), 2)),
      "can not invert for cf");
  cf = 0.455 / pow(log(0.06 * reynolds_number), 2);
  RAS(ref_math_divisible(2.0, cf), "can not invert cf");
  RAS(ref_math_divisible(sqrt(2.0 / cf), reynolds_number),
      "can not invert reynolds_number for yplus1");

  *yplus1 = sqrt(2.0 / cf) / reynolds_number;
  return REF_SUCCESS;
}